

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O3

void __thiscall tchecker::syncprod::syncprod_t::prev(syncprod_t *this)

{
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *in_RCX;
  incoming_edges_value_t *in_RDX;
  const_state_sptr_t *in_RSI;
  state_status_t in_R8D;
  
  prev((syncprod_t *)
       ((long)&this[-1]._transition_allocator.
               super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
               ._vedge_pool._collectables.
               super__Vector_base<std::shared_ptr<tchecker::collectable_t>,_std::allocator<std::shared_ptr<tchecker::collectable_t>_>_>
               ._M_impl.super__Vector_impl_data + 0x10),in_RSI,in_RDX,in_RCX,in_R8D);
  return;
}

Assistant:

void syncprod_t::prev(tchecker::syncprod::const_state_sptr_t const & s, incoming_edges_value_t const & in_edge,
                      std::vector<sst_t> & v, tchecker::state_status_t mask)
{
  tchecker::syncprod::state_sptr_t prevs = _state_allocator.clone(*s);
  tchecker::syncprod::transition_sptr_t t = _transition_allocator.construct();
  tchecker::state_status_t status = tchecker::syncprod::prev(*_system, *prevs, *t, in_edge);
  if (status & mask) {
    if (_sharing_type == tchecker::ts::SHARING) {
      share(prevs);
      share(t);
    }
    v.push_back(std::make_tuple(status, prevs, t));
  }
}